

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Line_SetTextureScale
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  side_t *this;
  int iVar1;
  double delta;
  side_t *side;
  int line;
  FLineIdIterator itr;
  double farg2;
  double farg1;
  int NO_CHANGE;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  delta = (double)arg1 / 65536.0;
  itr = (FLineIdIterator)((double)arg2 / 65536.0);
  if (((arg0 == 0) || (arg3 < 0)) || (1 < arg3)) {
    ln_local._4_4_ = 0;
  }
  else {
    FLineIdIterator::FLineIdIterator((FLineIdIterator *)&stack0xffffffffffffffb0,arg0);
    while (iVar1 = FLineIdIterator::Next((FLineIdIterator *)&stack0xffffffffffffffb0), -1 < iVar1) {
      this = lines[iVar1].sidedef[arg3];
      if (this != (side_t *)0x0) {
        if ((arg4 & 8U) == 0) {
          if (arg1 != 0x7fff0000) {
            if ((arg4 & 1U) != 0) {
              side_t::SetTextureXScale(this,0,delta);
            }
            if ((arg4 & 2U) != 0) {
              side_t::SetTextureXScale(this,1,delta);
            }
            if ((arg4 & 4U) != 0) {
              side_t::SetTextureXScale(this,2,delta);
            }
          }
          if (arg2 != 0x7fff0000) {
            if ((arg4 & 1U) != 0) {
              side_t::SetTextureYScale(this,0,(double)itr);
            }
            if ((arg4 & 2U) != 0) {
              side_t::SetTextureYScale(this,1,(double)itr);
            }
            if ((arg4 & 4U) != 0) {
              side_t::SetTextureYScale(this,2,(double)itr);
            }
          }
        }
        else {
          if (arg1 != 0x7fff0000) {
            if ((arg4 & 1U) != 0) {
              side_t::MultiplyTextureXScale(this,0,delta);
            }
            if ((arg4 & 2U) != 0) {
              side_t::MultiplyTextureXScale(this,1,delta);
            }
            if ((arg4 & 4U) != 0) {
              side_t::MultiplyTextureXScale(this,2,delta);
            }
          }
          if (arg2 != 0x7fff0000) {
            if ((arg4 & 1U) != 0) {
              side_t::MultiplyTextureYScale(this,0,(double)itr);
            }
            if ((arg4 & 2U) != 0) {
              side_t::MultiplyTextureYScale(this,1,(double)itr);
            }
            if ((arg4 & 4U) != 0) {
              side_t::MultiplyTextureYScale(this,2,(double)itr);
            }
          }
        }
      }
    }
    ln_local._4_4_ = 1;
  }
  return ln_local._4_4_;
}

Assistant:

FUNC(LS_Line_SetTextureScale)
// Line_SetTextureScale (id, x, y, side, flags)
{
	const int NO_CHANGE = 32767 << 16;
	double farg1 = arg1 / 65536.;
	double farg2 = arg2 / 65536.;

	if (arg0 == 0 || arg3 < 0 || arg3 > 1)
		return false;

	FLineIdIterator itr(arg0);
	int line;
	while ((line = itr.Next()) >= 0)
	{
		side_t *side = lines[line].sidedef[arg3];
		if (side != NULL)
		{
			if ((arg4&8)==0)
			{
				// set
				if (arg1 != NO_CHANGE)
				{
					if (arg4&1) side->SetTextureXScale(side_t::top, farg1);
					if (arg4&2) side->SetTextureXScale(side_t::mid, farg1);
					if (arg4&4) side->SetTextureXScale(side_t::bottom, farg1);
				}
				if (arg2 != NO_CHANGE)
				{
					if (arg4&1) side->SetTextureYScale(side_t::top, farg2);
					if (arg4&2) side->SetTextureYScale(side_t::mid, farg2);
					if (arg4&4) side->SetTextureYScale(side_t::bottom, farg2);
				}
			}
			else
			{
				// add
				if (arg1 != NO_CHANGE)
				{
					if (arg4&1) side->MultiplyTextureXScale(side_t::top, farg1);
					if (arg4&2) side->MultiplyTextureXScale(side_t::mid, farg1);
					if (arg4&4) side->MultiplyTextureXScale(side_t::bottom, farg1);
				}
				if (arg2 != NO_CHANGE)
				{
					if (arg4&1) side->MultiplyTextureYScale(side_t::top, farg2);
					if (arg4&2) side->MultiplyTextureYScale(side_t::mid, farg2);
					if (arg4&4) side->MultiplyTextureYScale(side_t::bottom, farg2);
				}
			}
		}
	}
	return true;
}